

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

void Sle_ManMarkupVariables(Sle_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int Entry;
  Gia_Man_t *p_00;
  int iVar5;
  
  p_00 = p->pGia;
  iVar1 = p_00->nObjs;
  p->nNodeVars = iVar1;
  Entry = iVar1;
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManObj(p_00,iVar5);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Vec_IntWriteEntry(p->vCutFirst,iVar5,Entry);
      piVar3 = Sle_ManList(p,iVar5);
      Entry = Entry + *piVar3;
    }
    p_00 = p->pGia;
    iVar1 = p_00->nObjs;
  }
  p->nCutVars = Entry - p->nNodeVars;
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManObj(p_00,iVar5);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Vec_IntWriteEntry(p->vEdgeFirst,iVar5,Entry);
      pVVar4 = Vec_WecEntry(p->vCutFanins,iVar5);
      Entry = Entry + pVVar4->nSize;
    }
    p_00 = p->pGia;
    iVar1 = p_00->nObjs;
  }
  p->nEdgeVars = Entry - (p->nCutVars + p->nNodeVars);
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManObj(p_00,iVar5);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Vec_IntWriteEntry(p->vDelayFirst,iVar5,Entry);
      Entry = Entry + p->nLevels;
    }
    p_00 = p->pGia;
    iVar1 = p_00->nObjs;
  }
  p->nDelayVars = Entry - (p->nEdgeVars + p->nCutVars + p->nNodeVars);
  p->nVarsTotal = Entry;
  return;
}

Assistant:

void Sle_ManMarkupVariables( Sle_Man_t * p )
{
    int iObj, Counter = Gia_ManObjNum(p->pGia);
    // node variables
    p->nNodeVars = Counter;
    // cut variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vCutFirst, iObj, Counter );
        Counter += Sle_ListCutNum( Sle_ManList(p, iObj) );
    }
    p->nCutVars = Counter - p->nNodeVars;
    // edge variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vEdgeFirst, iObj, Counter );
        Counter += Vec_IntSize( Vec_WecEntry(p->vCutFanins, iObj) );
    }
    p->nEdgeVars = Counter - p->nCutVars - p->nNodeVars;
    // delay variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vDelayFirst, iObj, Counter );
        Counter += p->nLevels;
    }
    p->nDelayVars = Counter - p->nEdgeVars - p->nCutVars - p->nNodeVars;
    p->nVarsTotal = Counter;
}